

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextBuffer::appendv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  va_list args_copy;
  __va_list_tag local_48;
  
  local_48.reg_save_area = args->reg_save_area;
  local_48.gp_offset = args->gp_offset;
  local_48.fp_offset = args->fp_offset;
  local_48.overflow_arg_area = args->overflow_arg_area;
  iVar6 = vsnprintf((char *)0x0,0,fmt,args);
  pIVar5 = GImGui;
  if (0 < iVar6) {
    iVar2 = (this->Buf).Size;
    iVar8 = iVar6 + iVar2;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 <= iVar8) {
      iVar9 = iVar3 * 2;
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 * -2 < 0) {
        iVar9 = iVar8;
      }
      if (iVar3 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pcVar7 = (char *)(*(pIVar5->IO).MemAllocFn)((long)iVar9);
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          memcpy(pcVar7,pcVar4,(long)(this->Buf).Size);
        }
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pcVar4);
        (this->Buf).Data = pcVar7;
        (this->Buf).Capacity = iVar9;
      }
    }
    pIVar5 = GImGui;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 < iVar8) {
      if (iVar3 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar3 / 2 + iVar3;
      }
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      if (iVar3 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pcVar7 = (char *)(*(pIVar5->IO).MemAllocFn)((long)iVar9);
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          memcpy(pcVar7,pcVar4,(long)(this->Buf).Size);
        }
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pcVar4);
        (this->Buf).Data = pcVar7;
        (this->Buf).Capacity = iVar9;
      }
    }
    (this->Buf).Size = iVar8;
    ImFormatStringV((this->Buf).Data + (long)iVar2 + -1,iVar6 + 1,fmt,&local_48);
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = vsnprintf(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
        return;

    const int write_off = Buf.Size;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off] - 1, len+1, fmt, args_copy);
}